

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteFullAdder(FILE *pFile)

{
  int fNaive;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,".model FA\n");
  fprintf((FILE *)pFile,".inputs a b cin\n");
  fprintf((FILE *)pFile,".outputs s cout\n");
  fprintf((FILE *)pFile,".names a b and1\n");
  fprintf((FILE *)pFile,"11 1\n");
  fprintf((FILE *)pFile,".names a b and1_\n");
  fprintf((FILE *)pFile,"00 1\n");
  fprintf((FILE *)pFile,".names and1 and1_ xor\n");
  fprintf((FILE *)pFile,"00 1\n");
  fprintf((FILE *)pFile,".names cin xor and2\n");
  fprintf((FILE *)pFile,"11 1\n");
  fprintf((FILE *)pFile,".names cin xor and2_\n");
  fprintf((FILE *)pFile,"00 1\n");
  fprintf((FILE *)pFile,".names and2 and2_ s\n");
  fprintf((FILE *)pFile,"00 1\n");
  fprintf((FILE *)pFile,".names and1 and2 cout\n");
  fprintf((FILE *)pFile,"00 0\n");
  fprintf((FILE *)pFile,".end\n");
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_WriteFullAdder( FILE * pFile )
{
    int fNaive = 0;
    fprintf( pFile, ".model FA\n" );
    fprintf( pFile, ".inputs a b cin\n" ); 
    fprintf( pFile, ".outputs s cout\n" ); 
    if ( fNaive )
    {
        fprintf( pFile, ".names a b k\n" ); 
        fprintf( pFile, "10 1\n" ); 
        fprintf( pFile, "01 1\n" ); 
        fprintf( pFile, ".names k cin s\n" ); 
        fprintf( pFile, "10 1\n" ); 
        fprintf( pFile, "01 1\n" ); 
        fprintf( pFile, ".names a b cin cout\n" ); 
        fprintf( pFile, "11- 1\n" ); 
        fprintf( pFile, "1-1 1\n" ); 
        fprintf( pFile, "-11 1\n" ); 
    }
    else
    {
        fprintf( pFile, ".names a b and1\n" ); 
        fprintf( pFile, "11 1\n" ); 
        fprintf( pFile, ".names a b and1_\n" ); 
        fprintf( pFile, "00 1\n" ); 
        fprintf( pFile, ".names and1 and1_ xor\n" ); 
        fprintf( pFile, "00 1\n" ); 

        fprintf( pFile, ".names cin xor and2\n" ); 
        fprintf( pFile, "11 1\n" ); 
        fprintf( pFile, ".names cin xor and2_\n" ); 
        fprintf( pFile, "00 1\n" ); 
        fprintf( pFile, ".names and2 and2_ s\n" ); 
        fprintf( pFile, "00 1\n" ); 

        fprintf( pFile, ".names and1 and2 cout\n" ); 
        fprintf( pFile, "00 0\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}